

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O0

int __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_3,bool param_4)

{
  uint uVar1;
  type_conflict5 tVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  char *pcVar6;
  ulong *puVar7;
  byte in_CL;
  int __c;
  int __c_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  long *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int leave;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lb;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *ub;
  IdxSet *idx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_19;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_16;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_15;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_14;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_17;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffebf8;
  cpp_dec_float<200U,_int,_void> *v;
  undefined6 in_stack_ffffffffffffec00;
  undefined1 in_stack_ffffffffffffec06;
  undefined1 in_stack_ffffffffffffec07;
  undefined1 uVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffec08;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffec10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_13e0;
  type_conflict5 local_13d2;
  type_conflict5 local_13d1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13b0;
  undefined1 local_1330 [64];
  double in_stack_ffffffffffffed10;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffed18;
  undefined8 local_12b0;
  undefined1 local_12a8 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1228;
  undefined1 local_11a8 [56];
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffee90;
  undefined1 local_1128 [128];
  ulong local_10a8;
  undefined1 local_10a0 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1020;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fa0;
  undefined1 local_f20 [128];
  undefined1 local_ea0 [128];
  undefined1 local_e20 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_da0;
  undefined1 local_d20 [128];
  undefined8 local_ca0;
  undefined1 local_c98 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b98;
  undefined1 local_b18 [128];
  ulong local_a98;
  undefined1 local_a90 [128];
  undefined1 local_a10 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_990;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_910;
  undefined1 local_890 [128];
  undefined1 local_810 [128];
  undefined4 local_790;
  uint local_78c;
  int local_788;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_784;
  int local_704;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_700;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_680;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_678;
  IdxSet *local_670;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_668;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_660;
  byte local_651;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_648;
  undefined8 local_638;
  undefined8 local_630;
  undefined1 *local_628;
  undefined8 local_620;
  ulong *local_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  ulong *local_5e8;
  undefined1 *local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5d8;
  undefined1 *local_5d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c8;
  undefined1 *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  cpp_dec_float<200U,_int,_void> *local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_598;
  undefined1 *local_590;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_588;
  undefined1 *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_570;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_568;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_560;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_550;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_548;
  undefined1 *local_540;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_538;
  undefined1 *local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_528;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_520;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_518;
  ulong *local_510;
  undefined8 local_508;
  ulong *local_500;
  undefined8 local_4f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_4e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  undefined1 *local_4b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_4a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_488;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_480;
  undefined1 *local_478;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_469;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  undefined1 *local_438;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_429;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_400;
  undefined1 *local_3f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  undefined1 *local_3b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  undefined1 *local_378;
  undefined8 *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  undefined8 *local_348;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_339;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined1 *local_2c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_279;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_239;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_651 = in_CL & 1;
  local_648 = in_RSI;
  pSVar4 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(**(code **)(*in_RDI + 0x18))();
  pUVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::fVec(pSVar4);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::delta(pUVar5);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(in_stack_ffffffffffffee90);
  pSVar4 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::fVec(pSVar4);
  local_660 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x77b970);
  pSVar4 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(**(code **)(*in_RDI + 0x18))();
  pUVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::fVec(pSVar4);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::delta(pUVar5);
  local_668 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::values((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x77b99b);
  pSVar4 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::fVec(pSVar4);
  local_670 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::idx((UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x77b9be);
  pSVar4 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::ubBound(pSVar4);
  local_678 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x77b9e1);
  pSVar4 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::lbBound(pSVar4);
  local_680 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x77ba04);
  (**(code **)(*in_RDI + 0x18))();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(in_stack_ffffffffffffec08);
  local_704 = -1;
  local_5d8 = &local_784;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffec07,
                      CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
  local_790 = 0;
  tVar2 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffec08,
                     (int *)CONCAT17(in_stack_ffffffffffffec07,
                                     CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)))
  ;
  if (tVar2) {
    for (local_78c = 0; uVar1 = local_78c, iVar3 = IdxSet::size(local_670), (int)uVar1 < iVar3;
        local_78c = local_78c + 1) {
      pcVar6 = IdxSet::index(local_670,(char *)(ulong)local_78c,__c);
      local_788 = (int)pcVar6;
      local_520 = local_668 + local_788;
      local_518 = &local_784;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffec07,
                          CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                 in_stack_ffffffffffffebf8);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffebf8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x77bb1d);
      if (tVar2) {
        local_630 = infinity();
        local_628 = local_810;
        local_638 = 0;
        local_4f8 = local_630;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffec10,(double)in_stack_ffffffffffffec08,
                   (type *)CONCAT17(in_stack_ffffffffffffec07,
                                    CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffebf8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x77bbaa);
        if (tVar2) {
          local_170 = local_678 + local_788;
          local_178 = local_660 + local_788;
          local_168 = &local_990;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_179,local_170,local_178);
          local_160 = &local_990;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
          local_148 = &local_990;
          local_150 = local_170;
          local_158 = local_178;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                     in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77bc88);
          local_f8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)in_RDI + 0x1c);
          local_e8 = &local_910;
          local_f0 = &local_990;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_f9,local_f0,local_f8);
          local_e0 = &local_910;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
          local_c8 = &local_910;
          local_d0 = local_f0;
          local_d8 = local_f8;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                     in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77bd40);
          local_398 = local_890;
          local_3a0 = &local_910;
          local_3a8 = &local_784;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_3a9,local_3a0,local_3a8);
          local_390 = local_890;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
          local_378 = local_890;
          local_380 = local_3a0;
          local_388 = local_3a8;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                     in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77bdf7);
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffebf8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x77be0c);
          if (tVar2) {
            local_704 = local_788;
            local_528 = local_648;
            local_530 = local_890;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                       in_stack_ffffffffffffebf8);
          }
        }
      }
      else {
        local_20 = local_a10;
        local_28 = &local_700;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_29,local_28);
        local_10 = local_a10;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                   in_stack_ffffffffffffebf8);
        local_8 = local_a10;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffebf8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x77bef8);
        if (tVar2) {
          puVar7 = (ulong *)infinity();
          local_a98 = *puVar7 ^ 0x8000000000000000;
          local_610 = local_a90;
          local_618 = &local_a98;
          local_620 = 0;
          local_500 = local_618;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffec10,(double)in_stack_ffffffffffffec08,
                     (type *)CONCAT17(in_stack_ffffffffffffec07,
                                      CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00))
                    );
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffebf8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x77bfb1);
          if (tVar2) {
            local_1b0 = local_680 + local_788;
            local_1b8 = local_660 + local_788;
            local_1a8 = &local_c18;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1b9,local_1b0,local_1b8);
            local_1a0 = &local_c18;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
            local_188 = &local_c18;
            local_190 = local_1b0;
            local_198 = local_1b8;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                       in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77c08f);
            local_1f8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)in_RDI + 0x1c);
            local_1e8 = &local_b98;
            local_1f0 = &local_c18;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1f9,local_1f0,local_1f8);
            local_1e0 = &local_b98;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
            local_1c8 = &local_b98;
            local_1d0 = local_1f0;
            local_1d8 = local_1f8;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                       in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77c147);
            local_3d8 = local_b18;
            local_3e0 = &local_b98;
            local_3e8 = &local_784;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_3e9,local_3e0,local_3e8);
            local_3d0 = local_b18;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
            local_3b8 = local_b18;
            local_3c0 = local_3e0;
            local_3c8 = local_3e8;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                       in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77c1fe);
            tVar2 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffebf8,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x77c213);
            if (tVar2) {
              local_704 = local_788;
              local_538 = local_648;
              local_540 = local_b18;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_ffffffffffffec07,
                                  CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                         in_stack_ffffffffffffebf8);
            }
          }
        }
      }
    }
    if (local_704 < 0) {
      return local_704;
    }
    local_550 = local_668 + local_704;
    local_548 = &local_784;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffec07,
                        CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
               in_stack_ffffffffffffebf8);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffebf8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x77c2e1);
    if (tVar2) {
      tVar2 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffebf8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x77c31a);
      local_13d1 = true;
      if (tVar2) goto LAB_0077c415;
    }
    local_50 = local_c98;
    local_58 = &local_700;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_59,local_58);
    local_40 = local_c98;
    local_48 = local_58;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffec07,
                        CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
               in_stack_ffffffffffffebf8);
    local_38 = local_c98;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffec07,
                        CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffebf8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x77c3c7);
    local_13d2 = false;
    if (tVar2) {
      local_13d2 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffebf8,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x77c409);
    }
    local_13d1 = local_13d2;
LAB_0077c415:
    if (local_13d1 == false) {
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffebf8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x77c48e);
      if (tVar2) {
        local_13e0 = local_678 + local_704;
      }
      else {
        local_13e0 = local_680 + local_704;
      }
      local_558 = local_648;
      local_560 = local_13e0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffec07,
                          CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                 in_stack_ffffffffffffebf8);
      local_238 = local_660 + local_704;
      local_228 = &local_da0;
      local_230 = local_648;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_239,local_648,local_238);
      local_220 = &local_da0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffec07,
                          CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
      local_208 = &local_da0;
      local_210 = local_230;
      local_218 = local_238;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffec07,
                          CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                 in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77c5c6);
      local_418 = local_d20;
      local_420 = &local_da0;
      local_428 = &local_784;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_429,local_420,local_428);
      local_410 = local_d20;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffec07,
                          CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
      local_3f8 = local_d20;
      local_400 = local_420;
      local_408 = local_428;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffec07,
                          CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                 in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77c67d);
      local_5b8 = local_648;
      local_5c0 = local_d20;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffec07,
                          CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                 in_stack_ffffffffffffebf8);
      return local_704;
    }
    local_ca0 = 0;
    local_350 = local_648;
    local_358 = &local_ca0;
    local_348 = local_358;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_ffffffffffffed18,in_stack_ffffffffffffed10);
    return local_704;
  }
  for (local_78c = 0; uVar1 = local_78c, iVar3 = IdxSet::size(local_670), (int)uVar1 < iVar3;
      local_78c = local_78c + 1) {
    pcVar6 = IdxSet::index(local_670,(char *)(ulong)local_78c,__c_00);
    local_788 = (int)pcVar6;
    local_570 = local_668 + local_788;
    local_568 = &local_784;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffec07,
                        CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
               in_stack_ffffffffffffebf8);
    local_80 = local_e20;
    local_88 = &local_700;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_89,local_88);
    local_70 = local_e20;
    local_78 = local_88;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffec07,
                        CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
               in_stack_ffffffffffffebf8);
    local_68 = local_e20;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffec07,
                        CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffebf8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x77c7e5);
    if (tVar2) {
      in_stack_ffffffffffffec10 = &local_678[local_788].m_backend;
      local_600 = infinity();
      local_5f8 = local_ea0;
      local_608 = 0;
      local_508 = local_600;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffec10,(double)in_stack_ffffffffffffec08,
                 (type *)CONCAT17(in_stack_ffffffffffffec07,
                                  CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffebf8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x77c872);
      if (tVar2) {
        local_270 = local_678 + local_788;
        local_278 = local_660 + local_788;
        local_268 = &local_1020;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_279,local_270,local_278);
        local_260 = &local_1020;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
        local_248 = &local_1020;
        local_250 = local_270;
        local_258 = local_278;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                   in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77c950);
        local_138 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)in_RDI + 0x1c);
        local_128 = &local_fa0;
        local_130 = &local_1020;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_139,local_130,local_138);
        local_120 = &local_fa0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
        local_108 = &local_fa0;
        local_110 = local_130;
        local_118 = local_138;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                   in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77ca08);
        local_458 = local_f20;
        local_460 = &local_fa0;
        local_468 = &local_784;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_469,local_460,local_468);
        local_450 = local_f20;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
        local_438 = local_f20;
        local_440 = local_460;
        local_448 = local_468;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffec07,
                            CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                   in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77cabf);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffebf8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x77cad4);
        if (tVar2) {
          local_704 = local_788;
          local_578 = local_648;
          local_580 = local_f20;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                     in_stack_ffffffffffffebf8);
        }
      }
    }
    else {
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffebf8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x77cb39);
      if (tVar2) {
        in_stack_ffffffffffffec08 =
             (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)(local_680 + local_788);
        puVar7 = (ulong *)infinity();
        local_10a8 = *puVar7 ^ 0x8000000000000000;
        local_5e0 = local_10a0;
        local_5e8 = &local_10a8;
        local_5f0 = 0;
        local_510 = local_5e8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffec10,(double)in_stack_ffffffffffffec08,
                   (type *)CONCAT17(in_stack_ffffffffffffec07,
                                    CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffebf8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x77cbf2);
        if (tVar2) {
          local_2b0 = local_680 + local_788;
          local_2b8 = local_660 + local_788;
          local_2a8 = &local_1228;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_2b9,local_2b0,local_2b8);
          local_2a0 = &local_1228;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
          local_288 = &local_1228;
          local_290 = local_2b0;
          local_298 = local_2b8;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                     in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77ccd0);
          local_2f8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)in_RDI + 0x1c);
          local_2e8 = local_11a8;
          local_2f0 = &local_1228;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_2f9,local_2f0,local_2f8);
          local_2e0 = local_11a8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
          local_2c8 = local_11a8;
          local_2d0 = local_2f0;
          local_2d8 = local_2f8;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                     in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77cd88);
          local_498 = local_1128;
          local_4a0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_11a8;
          local_4a8 = &local_784;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_4a9,local_4a0,local_4a8);
          local_490 = local_1128;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
          local_478 = local_1128;
          local_480 = local_4a0;
          local_488 = local_4a8;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffec07,
                              CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                     in_stack_ffffffffffffebf8,(cpp_dec_float<200U,_int,_void> *)0x77ce3f);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffebf8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x77ce54);
          if (tVar2) {
            local_704 = local_788;
            local_588 = local_648;
            local_590 = local_1128;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffec07,
                                CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
                       in_stack_ffffffffffffebf8);
          }
        }
      }
    }
  }
  if (local_704 < 0) {
    return local_704;
  }
  local_5a0 = local_668 + local_704;
  local_598 = &local_784;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffec07,
                      CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
             in_stack_ffffffffffffebf8);
  local_b0 = local_12a8;
  local_b8 = &local_700;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_b9,local_b8);
  local_a0 = local_12a8;
  local_a8 = local_b8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffec07,
                      CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),
             in_stack_ffffffffffffebf8);
  local_98 = local_12a8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffec07,
                      CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
  tVar2 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffebf8,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x77cfa9);
  if (tVar2) {
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffebf8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x77cfe2);
    uVar8 = true;
    if (tVar2) goto LAB_0077d052;
  }
  tVar2 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffebf8,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x77d004);
  in_stack_ffffffffffffec06 = false;
  uVar8 = in_stack_ffffffffffffec06;
  if (tVar2) {
    in_stack_ffffffffffffec06 =
         boost::multiprecision::operator<=
                   ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)in_stack_ffffffffffffebf8,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x77d046);
    uVar8 = in_stack_ffffffffffffec06;
  }
LAB_0077d052:
  if ((type_conflict5)uVar8 == false) {
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffebf8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x77d0cb);
    if (tVar2) {
      v = &local_678[local_704].m_backend;
    }
    else {
      v = &local_680[local_704].m_backend;
    }
    local_5a8 = local_648;
    local_5b0 = v;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),v);
    local_338 = local_660 + local_704;
    local_328 = &local_13b0;
    local_330 = local_648;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_339,local_648,local_338);
    local_320 = &local_13b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
    local_308 = &local_13b0;
    local_310 = local_330;
    local_318 = local_338;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),v,
               (cpp_dec_float<200U,_int,_void> *)0x77d1f7);
    local_4d8 = local_1330;
    local_4e0 = &local_13b0;
    local_4e8 = &local_784;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_4e9,local_4e0,local_4e8);
    local_4d0 = local_1330;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)));
    local_4b8 = local_1330;
    local_4c0 = local_4e0;
    local_4c8 = local_4e8;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),v,
               (cpp_dec_float<200U,_int,_void> *)0x77d2ab);
    local_5c8 = local_648;
    local_5d0 = local_1330;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffec06,in_stack_ffffffffffffec00)),v);
  }
  else {
    local_12b0 = 0;
    local_368 = local_648;
    local_370 = &local_12b0;
    local_360 = local_370;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_ffffffffffffed18,in_stack_ffffffffffffed10);
  }
  return local_704;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}